

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O1

Aig_Man_t * Saig_ManCreateMiter(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  void *pvVar1;
  uint uVar2;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  Aig_Obj_t *pAVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  
  if ((p0->nRegs < 1) && (p1->nRegs < 1)) {
    __assert_fail("Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x69,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nTruePis != p1->nTruePis) {
    __assert_fail("Saig_ManPiNum(p0) == Saig_ManPiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  if (p0->nTruePos != p1->nTruePos) {
    __assert_fail("Saig_ManPoNum(p0) == Saig_ManPoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6b,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  p = Aig_ManStart(p1->vObjs->nSize + p0->vObjs->nSize);
  pcVar3 = (char *)malloc(6);
  builtin_strncpy(pcVar3,"miter",6);
  p->pName = pcVar3;
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  p0->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  p1->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  if (0 < p0->nTruePis) {
    lVar11 = 0;
    do {
      if (p0->vCis->nSize <= lVar11) goto LAB_006e0a62;
      pvVar1 = p0->vCis->pArray[lVar11];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      lVar11 = lVar11 + 1;
    } while (lVar11 < p0->nTruePis);
  }
  if (0 < p1->nTruePis) {
    lVar11 = 0;
    do {
      if ((p1->vCis->nSize <= lVar11) || (p->vCis->nSize <= lVar11)) goto LAB_006e0a62;
      *(void **)((long)p1->vCis->pArray[lVar11] + 0x28) = p->vCis->pArray[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar11 < p1->nTruePis);
  }
  if (0 < p0->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = p0->nTruePis + iVar9;
      if (((int)uVar2 < 0) || (p0->vCis->nSize <= (int)uVar2)) goto LAB_006e0a62;
      pvVar1 = p0->vCis->pArray[uVar2];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar9 = iVar9 + 1;
    } while (iVar9 < p0->nRegs);
  }
  if (0 < p1->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = p1->nTruePis + iVar9;
      if (((int)uVar2 < 0) || (p1->vCis->nSize <= (int)uVar2)) goto LAB_006e0a62;
      pvVar1 = p1->vCis->pArray[uVar2];
      pAVar4 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar9 = iVar9 + 1;
    } while (iVar9 < p1->nRegs);
  }
  pVVar6 = p0->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar11];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p0->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  pVVar6 = p1->vObjs;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar11];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        uVar5 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
        *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p1->vObjs;
    } while (lVar11 < pVVar6->nSize);
  }
  if (0 < p0->nTruePos) {
    lVar11 = 0;
    do {
      if (p0->vCos->nSize <= lVar11) goto LAB_006e0a62;
      pvVar1 = p0->vCos->pArray[lVar11];
      if (Oper == 1) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        if (p1->vCos->nSize <= lVar11) goto LAB_006e0a62;
        pvVar1 = p1->vCos->pArray[lVar11];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8);
        uVar7 = uVar5 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Aig_Obj_t *)0x1;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28) ^ 1);
        }
        pAVar4 = Aig_And(p,pAVar4,pAVar8);
      }
      else {
        if (Oper != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                        ,0x8a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
        }
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar5 == 0) {
          pAVar4 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar4 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
        }
        if (p1->vCos->nSize <= lVar11) goto LAB_006e0a62;
        pvVar1 = p1->vCos->pArray[lVar11];
        if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
        uVar5 = *(ulong *)((long)pvVar1 + 8);
        uVar7 = uVar5 & 0xfffffffffffffffe;
        if (uVar7 == 0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
        }
        pAVar4 = Aig_Exor(p,pAVar4,pAVar8);
      }
      Aig_ObjCreateCo(p,pAVar4);
      lVar11 = lVar11 + 1;
    } while (lVar11 < p0->nTruePos);
  }
  if (0 < p0->nRegs) {
    iVar9 = 0;
    do {
      uVar2 = p0->nTruePos + iVar9;
      if (((int)uVar2 < 0) || (p0->vCos->nSize <= (int)uVar2)) goto LAB_006e0a62;
      pvVar1 = p0->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) goto LAB_006e0a81;
      uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar9 = iVar9 + 1;
    } while (iVar9 < p0->nRegs);
  }
  iVar9 = p1->nRegs;
  if (0 < iVar9) {
    iVar10 = 0;
    do {
      uVar2 = p1->nTruePos + iVar10;
      if (((int)uVar2 < 0) || (p1->vCos->nSize <= (int)uVar2)) {
LAB_006e0a62:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = p1->vCos->pArray[uVar2];
      if (((ulong)pvVar1 & 1) != 0) {
LAB_006e0a81:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar5 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        pAVar4 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar4 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_ObjCreateCo(p,pAVar4);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar4;
      iVar10 = iVar10 + 1;
      iVar9 = p1->nRegs;
    } while (iVar10 < iVar9);
  }
  Aig_ManSetRegNum(p,iVar9 + p0->nRegs);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateMiter( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0 );
    assert( Saig_ManPiNum(p0) == Saig_ManPiNum(p1) );
    assert( Saig_ManPoNum(p0) == Saig_ManPoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs
    Saig_ManForEachPi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachPi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map register outputs
    Saig_ManForEachLo( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Saig_ManForEachPo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // create register inputs
    Saig_ManForEachLi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // cleanup
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p0) + Saig_ManRegNum(p1) );
//    Aig_ManCleanup( pNew );
    return pNew;
}